

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

void __thiscall QUrlPrivate::~QUrlPrivate(QUrlPrivate *this)

{
  unique_ptr<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_> *in_RDI;
  
  std::unique_ptr<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>::~unique_ptr(in_RDI)
  ;
  QString::~QString((QString *)0x305254);
  QString::~QString((QString *)0x305265);
  QString::~QString((QString *)0x305273);
  QString::~QString((QString *)0x305281);
  QString::~QString((QString *)0x30528f);
  QString::~QString((QString *)0x30529d);
  QString::~QString((QString *)0x3052ab);
  return;
}

Assistant:

inline QUrlPrivate::~QUrlPrivate()
    = default;